

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool mz_zip_writer_write_zeros(mz_zip_archive *pZip,mz_uint64 cur_file_ofs,mz_uint32 n)

{
  ulong uVar1;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  mz_uint32 s;
  char buf [4096];
  ulong local_1048;
  size_t local_1040;
  undefined1 local_1028 [4100];
  uint local_24;
  long local_20;
  long local_18;
  
  if (in_EDX < 0x1001) {
    local_1040 = (size_t)in_EDX;
  }
  else {
    local_1040 = 0x1000;
  }
  local_24 = in_EDX;
  local_20 = in_RSI;
  local_18 = in_RDI;
  memset(local_1028,0,local_1040);
  while( true ) {
    if (local_24 == 0) {
      return 1;
    }
    if (local_24 < 0x1001) {
      local_1048 = (ulong)local_24;
    }
    else {
      local_1048 = 0x1000;
    }
    uVar1 = (**(code **)(local_18 + 0x50))
                      (*(undefined8 *)(local_18 + 0x60),local_20,local_1028,local_1048);
    if (uVar1 != local_1048) break;
    local_20 = local_1048 + local_20;
    local_24 = local_24 - (int)local_1048;
  }
  if (local_18 != 0) {
    *(undefined4 *)(local_18 + 0x1c) = 0x13;
  }
  return 0;
}

Assistant:

static mz_bool mz_zip_writer_write_zeros(mz_zip_archive *pZip,
                                         mz_uint64 cur_file_ofs, mz_uint32 n) {
  char buf[4096];
  memset(buf, 0, MZ_MIN(sizeof(buf), n));
  while (n) {
    mz_uint32 s = MZ_MIN(sizeof(buf), n);
    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_file_ofs, buf, s) != s)
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

    cur_file_ofs += s;
    n -= s;
  }
  return MZ_TRUE;
}